

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  code *pcVar1;
  router *this;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  rpc_server *prVar2;
  uint uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  invalid_argument *piVar6;
  pointer *__ptr;
  long lVar7;
  IntermediateData IVar8;
  dummy d;
  thread thd;
  bool stop;
  rpc_server server;
  _Any_data local_468;
  _Manager_type local_458;
  _Invoker_type local_450;
  uint local_448;
  dummy local_441;
  code *local_440;
  undefined8 local_438;
  undefined1 local_430 [20];
  uint local_41c;
  undefined8 local_418;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  rpc_server local_3e0;
  
  uVar3 = std::thread::hardware_concurrency();
  rest_rpc::rpc_service::rpc_server::rpc_server(&local_3e0,9000,(ulong)uVar3,0xe10,10);
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"add","");
  local_440 = dummy::add;
  local_438 = 0;
  this = &local_3e0.router_;
  rest_rpc::rpc_service::router::
  register_handler<false,int(dummy::*)(std::weak_ptr<rest_rpc::rpc_service::connection>,int,int),dummy>
            (this,(string *)&local_468,(offset_in_dummy_to_subr *)&local_440,&local_441);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"get_dummy","");
  rest_rpc::rpc_service::router::
  register_handler<false,dummy1(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,dummy1)>
            (this,(string *)&local_468,get_dummy,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"translate","");
  rest_rpc::rpc_service::router::
  register_handler<false,std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (this,(string *)&local_468,translate,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"hello","");
  rest_rpc::rpc_service::router::
  register_handler<false,void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (this,(string *)&local_468,hello,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"get_person_name","");
  rest_rpc::rpc_service::router::
  register_handler<false,std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&)>
            (this,(string *)&local_468,get_person_name_abi_cxx11_,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"get_person","");
  rest_rpc::rpc_service::router::
  register_handler<false,person(*)(std::weak_ptr<rest_rpc::rpc_service::connection>)>
            (this,(string *)&local_468,get_person,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"upload","");
  rest_rpc::rpc_service::router::
  register_handler<false,void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
            (this,(string *)&local_468,upload,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"download","");
  rest_rpc::rpc_service::router::
  register_handler<false,std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (this,(string *)&local_468,download,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"get_name","");
  rest_rpc::rpc_service::router::
  register_handler<false,std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&)>
            (this,(string *)&local_468,get_name_abi_cxx11_,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"delay_echo","");
  rest_rpc::rpc_service::router::
  register_handler<false,void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (this,(string *)&local_468,delay_echo,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"echo","");
  rest_rpc::rpc_service::router::
  register_handler<false,std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&)>
            (this,(string *)&local_468,echo,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_468._M_unused._M_object = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"get_int","");
  rest_rpc::rpc_service::router::
  register_handler<false,int(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,int)>
            (this,(string *)&local_468,get_int,false);
  if ((_Manager_type *)local_468._M_unused._0_8_ != &local_458) {
    operator_delete(local_468._M_unused._M_object);
  }
  local_440 = (code *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"publish_by_token","");
  lVar7 = 0;
  do {
    pcVar1 = local_440 + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pcVar1 != (code)0x0);
  IVar8 = rest_rpc::MD5::MD5CE::ProcessMessage((char *)local_440,(int)lVar7 - 1);
  uVar3 = IVar8.a;
  local_448 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  this_00 = &local_3e0.router_.key2func_name_;
  iVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_448);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00,&local_448,&local_440);
    local_41c = local_448;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_41c);
    uStack_410 = 0;
    uStack_40c = 0;
    local_468._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(pmVar5->super__Function_base)._M_functor;
    local_468._8_8_ = *(undefined8 *)((long)&(pmVar5->super__Function_base)._M_functor + 8);
    *(rpc_server **)&(pmVar5->super__Function_base)._M_functor = &local_3e0;
    *(undefined4 *)((long)&(pmVar5->super__Function_base)._M_functor + 8) = 0;
    *(undefined4 *)((long)&(pmVar5->super__Function_base)._M_functor + 0xc) = 0;
    local_458 = (pmVar5->super__Function_base)._M_manager;
    (pmVar5->super__Function_base)._M_manager =
         std::
         _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
         ::_M_manager;
    local_450 = pmVar5->_M_invoker;
    pmVar5->_M_invoker =
         std::
         _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
         ::_M_invoke;
    local_418 = &local_3e0;
    if (local_458 != (_Manager_type)0x0) {
      (*local_458)(&local_468,&local_468,__destroy_functor);
    }
    if (local_440 != (code *)local_430) {
      operator_delete(local_440);
    }
    local_440 = (code *)local_430;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"publish","");
    lVar7 = 0;
    do {
      pcVar1 = local_440 + lVar7;
      lVar7 = lVar7 + 1;
    } while (*pcVar1 != (code)0x0);
    IVar8 = rest_rpc::MD5::MD5CE::ProcessMessage((char *)local_440,(int)lVar7 - 1);
    uVar3 = IVar8.a;
    local_448 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_448);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_00,&local_448,&local_440);
      local_41c = local_448;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_41c);
      uStack_410 = 0;
      uStack_40c = 0;
      local_468._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(pmVar5->super__Function_base)._M_functor;
      local_468._8_8_ = *(undefined8 *)((long)&(pmVar5->super__Function_base)._M_functor + 8);
      *(rpc_server **)&(pmVar5->super__Function_base)._M_functor = &local_3e0;
      *(undefined4 *)((long)&(pmVar5->super__Function_base)._M_functor + 8) = 0;
      *(undefined4 *)((long)&(pmVar5->super__Function_base)._M_functor + 0xc) = 0;
      local_458 = (pmVar5->super__Function_base)._M_manager;
      (pmVar5->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
           ::_M_manager;
      local_450 = pmVar5->_M_invoker;
      pmVar5->_M_invoker =
           std::
           _Function_handler<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/router.h:191:32)>
           ::_M_invoke;
      local_418 = &local_3e0;
      if (local_458 != (_Manager_type)0x0) {
        (*local_458)(&local_468,&local_468,__destroy_functor);
      }
      if (local_440 != (code *)local_430) {
        operator_delete(local_440);
      }
      local_408._M_unused._M_object = (void *)0x0;
      local_408._8_8_ = 0;
      local_3f0 = std::
                  _Function_handler<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/examples/server/main.cpp:155:7)>
                  ::_M_invoke;
      local_3f8 = std::
                  _Function_handler<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/examples/server/main.cpp:155:7)>
                  ::_M_manager;
      std::
      function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator=(&local_3e0.on_net_err_callback_,
                  (function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)&local_408);
      prVar2 = local_418;
      if (local_3f8 != (code *)0x0) {
        (*local_3f8)(&local_408,&local_408,__destroy_functor);
        prVar2 = local_418;
      }
      local_418._4_4_ = (undefined4)((ulong)prVar2 >> 0x20);
      local_418._0_4_ = (uint)prVar2;
      local_418._0_4_ = (uint)local_418 & 0xffffff00;
      local_440 = (code *)0x0;
      local_468._M_unused._M_object = operator_new(0x18);
      *(undefined ***)local_468._M_unused._0_8_ = &PTR___State_00164c48;
      *(rpc_server **)((long)local_468._M_unused._0_8_ + 8) = &local_3e0;
      *(undefined8 **)((long)local_468._M_unused._0_8_ + 0x10) = &local_418;
      std::thread::_M_start_thread(&local_440,&local_468,0);
      if ((long *)local_468._M_unused._0_8_ != (long *)0x0) {
        (**(code **)(*local_468._M_unused._M_object + 8))();
      }
      rest_rpc::rpc_service::io_service_pool::run(&local_3e0.io_service_pool_);
      local_418._0_4_ = CONCAT31(local_418._1_3_,1);
      std::thread::join();
      if (local_440 == (code *)0x0) {
        rest_rpc::rpc_service::rpc_server::~rpc_server(&local_3e0);
        return 0;
      }
      std::terminate();
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"duplicate registration key !");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"duplicate registration key !");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main() {
  //  benchmark_test();
  rpc_server server(9000, std::thread::hardware_concurrency(), 3600);

  dummy d;
  server.register_handler("add", &dummy::add, &d);

  server.register_handler("get_dummy", get_dummy);

  server.register_handler("translate", translate);
  server.register_handler("hello", hello);
  server.register_handler("get_person_name", get_person_name);
  server.register_handler("get_person", get_person);
  server.register_handler("upload", upload);
  server.register_handler("download", download);
  server.register_handler("get_name", get_name);
  server.register_handler("delay_echo", delay_echo);
  server.register_handler("echo", echo);
  server.register_handler("get_int", get_int);

  server.register_handler("publish_by_token", [&server](rpc_conn conn,
                                                        std::string key,
                                                        std::string token,
                                                        std::string val) {
    server.publish_by_token(std::move(key), std::move(token), std::move(val));
  });

  server.register_handler("publish",
                          [&server](rpc_conn conn, std::string key,
                                    std::string token, std::string val) {
                            server.publish(std::move(key), std::move(val));
                          });
  server.set_network_err_callback(
      [](std::shared_ptr<connection> conn, std::string reason) {
        std::cout << "remote client address: " << conn->remote_address()
                  << " networking error, reason: " << reason << "\n";
      });

  bool stop = false;
  std::thread thd([&server, &stop] {
    person p{1, "tom", 20};
    while (!stop) {
      server.publish("key", "hello subscriber");
      auto list = server.get_token_list();
      for (auto &token : list) {
        server.publish_by_token("key", token, p);
        server.publish_by_token("key1", token, "hello subscriber1");
      }
      std::this_thread::sleep_for(std::chrono::milliseconds(50));
    }
  });

  server.run();
  stop = true;
  thd.join();
}